

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void check_cast_instruction(dmr_C *C,instruction *insn)

{
  instruction_list *piVar1;
  bool bVar2;
  bool bVar3;
  int newsigned;
  int oldsigned;
  int new;
  int old;
  symbol *orig_type;
  instruction *insn_local;
  dmr_C *C_local;
  
  piVar1 = (insn->field_6).field_4.phi_users;
  if (piVar1 != (instruction_list *)0x0) {
    bVar2 = ((ulong)piVar1->list_[8] & 0x40) != 0;
    bVar3 = ((undefined1  [64])*insn & (undefined1  [64])0xff) == (undefined1  [64])0x31;
    if (*(int *)(piVar1->list_ + 6) < (int)(*(uint *)insn >> 8)) {
      if ((bVar2 != bVar3) && (!bVar3)) {
        dmrC_warning(C,insn->pos,"cast loses sign");
      }
    }
    else if ((int)(*(uint *)insn >> 8) < *(int *)(piVar1->list_ + 6)) {
      dmrC_warning(C,insn->pos,"cast drops bits");
    }
    else if (bVar2 == bVar3) {
      dmrC_warning(C,insn->pos,"cast wasn\'t removed");
    }
    else {
      dmrC_warning(C,insn->pos,"cast changes sign");
    }
  }
  return;
}

Assistant:

static void check_cast_instruction(struct dmr_C *C, struct instruction *insn)
{
	struct symbol *orig_type = insn->orig_type;
	if (orig_type) {
		int old = orig_type->bit_size;
		int new = insn->size;
		int oldsigned = (orig_type->ctype.modifiers & MOD_SIGNED) != 0;
		int newsigned = insn->opcode == OP_SCAST;

		if (new > old) {
			if (oldsigned == newsigned)
				return;
			if (newsigned)
				return;
			dmrC_warning(C, insn->pos, "cast loses sign");
			return;
		}
		if (new < old) {
			dmrC_warning(C, insn->pos, "cast drops bits");
			return;
		}
		if (oldsigned == newsigned) {
			dmrC_warning(C, insn->pos, "cast wasn't removed");
			return;
		}
		dmrC_warning(C, insn->pos, "cast changes sign");
	}
}